

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nested_loop_join_inner.cpp
# Opt level: O3

idx_t duckdb::RefineNestedLoopJoin::Operation<duckdb::interval_t,duckdb::DistinctFrom>
                (Vector *left,Vector *right,idx_t left_size,idx_t right_size,idx_t *lpos,idx_t *rpos
                ,SelectionVector *lvector,SelectionVector *rvector,idx_t current_match_count)

{
  int iVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  sel_t *psVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  idx_t iVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  bool bVar19;
  bool bVar20;
  UnifiedVectorFormat right_data;
  UnifiedVectorFormat left_data;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
  Vector::ToUnifiedFormat(left,left_size,&local_78);
  Vector::ToUnifiedFormat(right,right_size,&local_c0);
  if (current_match_count == 0) {
    iVar12 = 0;
  }
  else {
    psVar2 = lvector->sel_vector;
    psVar3 = rvector->sel_vector;
    psVar4 = (local_78.sel)->sel_vector;
    psVar5 = (local_c0.sel)->sel_vector;
    iVar12 = 0;
    uVar18 = 0;
    do {
      uVar16 = uVar18;
      if (psVar2 != (sel_t *)0x0) {
        uVar16 = (ulong)psVar2[uVar18];
      }
      uVar17 = uVar18;
      if (psVar3 != (sel_t *)0x0) {
        uVar17 = (ulong)psVar3[uVar18];
      }
      uVar8 = uVar16;
      if (psVar4 != (sel_t *)0x0) {
        uVar8 = (ulong)psVar4[uVar16];
      }
      uVar10 = uVar17;
      if (psVar5 != (sel_t *)0x0) {
        uVar10 = (ulong)psVar5[uVar17];
      }
      if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        bVar19 = false;
      }
      else {
        bVar19 = (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                  [uVar8 >> 6] >> (uVar8 & 0x3f) & 1) == 0;
      }
      if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        bVar20 = false;
      }
      else {
        bVar20 = (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                  [uVar10 >> 6] >> (uVar10 & 0x3f) & 1) == 0;
      }
      if ((bVar19 | bVar20) == 1) {
        if (bVar19 != bVar20) {
LAB_017d7ef8:
          psVar2[iVar12] = (sel_t)uVar16;
          psVar3[iVar12] = (sel_t)uVar17;
          iVar12 = iVar12 + 1;
        }
      }
      else {
        lVar11 = uVar10 * 0x10;
        lVar9 = uVar8 * 0x10;
        iVar1 = *(int *)(local_78.data + lVar9 + 4);
        iVar14 = *(int *)(local_c0.data + lVar11 + 4);
        lVar6 = *(long *)(local_78.data + lVar9 + 8);
        lVar7 = *(long *)(local_c0.data + lVar11 + 8);
        if (((*(int *)(local_78.data + lVar9) != *(int *)(local_c0.data + lVar11)) ||
            (iVar1 != iVar14)) || (iVar14 = iVar1, lVar6 != lVar7)) {
          lVar13 = (long)iVar1 + lVar6 / 86400000000;
          lVar15 = (long)iVar14 + lVar7 / 86400000000;
          if ((((long)*(int *)(local_78.data + lVar9) + lVar13 / 0x1e !=
                (long)*(int *)(local_c0.data + lVar11) + lVar15 / 0x1e) ||
              (lVar13 % 0x1e != lVar15 % 0x1e)) || (lVar6 % 86400000000 != lVar7 % 86400000000))
          goto LAB_017d7ef8;
        }
      }
      uVar18 = uVar18 + 1;
    } while (current_match_count != uVar18);
  }
  if (local_c0.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return iVar12;
}

Assistant:

static idx_t Operation(Vector &left, Vector &right, idx_t left_size, idx_t right_size, idx_t &lpos, idx_t &rpos,
	                       SelectionVector &lvector, SelectionVector &rvector, idx_t current_match_count) {
		using MATCH_OP = ComparisonOperationWrapper<OP>;

		UnifiedVectorFormat left_data, right_data;
		left.ToUnifiedFormat(left_size, left_data);
		right.ToUnifiedFormat(right_size, right_data);

		// refine phase of the nested loop join
		// refine lvector and rvector based on matches of subsequent conditions (in case there are multiple conditions
		// in the join)
		D_ASSERT(current_match_count > 0);
		auto ldata = UnifiedVectorFormat::GetData<T>(left_data);
		auto rdata = UnifiedVectorFormat::GetData<T>(right_data);
		idx_t result_count = 0;
		for (idx_t i = 0; i < current_match_count; i++) {
			auto lidx = lvector.get_index(i);
			auto ridx = rvector.get_index(i);
			auto left_idx = left_data.sel->get_index(lidx);
			auto right_idx = right_data.sel->get_index(ridx);
			bool left_is_valid = left_data.validity.RowIsValid(left_idx);
			bool right_is_valid = right_data.validity.RowIsValid(right_idx);
			if (MATCH_OP::Operation(ldata[left_idx], rdata[right_idx], !left_is_valid, !right_is_valid)) {
				lvector.set_index(result_count, lidx);
				rvector.set_index(result_count, ridx);
				result_count++;
			}
		}
		return result_count;
	}